

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QWidgetList *
focusPath(QWidgetList *__return_storage_ptr__,QWidget *from,QWidget *to,FocusDirection direction)

{
  Data *pDVar1;
  QWidget **ppQVar2;
  qsizetype qVar3;
  bool bVar4;
  long in_FS_OFFSET;
  initializer_list<QWidget_*> args;
  QArrayDataPointer<QWidget_*> local_58;
  QWidget *current;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  args._M_len = 1;
  args._M_array = &current;
  current = from;
  QList<QWidget_*>::QList((QList<QWidget_*> *)&local_58,args);
  if (from != to) {
    current = from;
    do {
      if (direction == Next) {
        current = *(QWidget **)(*(long *)(*(long *)(*(long *)&current->field_0x8 + 8) + 8) + 0x80);
      }
      else if (direction == Previous) {
        current = *(QWidget **)(*(long *)(*(long *)(*(long *)&current->field_0x8 + 8) + 8) + 0x88);
      }
      bVar4 = QListSpecialMethodsBase<QWidget*>::contains<QWidget*>
                        ((QListSpecialMethodsBase<QWidget*> *)&local_58,&current);
      if (bVar4) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (QWidget **)0x0;
        (__return_storage_ptr__->d).size = 0;
        goto LAB_00303fde;
      }
      QList<QWidget_*>::append((QList<QWidget_*> *)&local_58,current);
    } while (current != to);
  }
  qVar3 = local_58.size;
  ppQVar2 = local_58.ptr;
  pDVar1 = local_58.d;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QWidget **)0x0;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = ppQVar2;
  local_58.size = 0;
  (__return_storage_ptr__->d).size = qVar3;
LAB_00303fde:
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QWidgetList focusPath(QWidget *from, QWidget *to, QWidgetPrivate::FocusDirection direction)
{
    QWidgetList path({from});
    if (from == to)
        return path;

    QWidget *current = from;
    do {
        switch (direction) {
        case QWidgetPrivate::FocusDirection::Previous:
            current = current->previousInFocusChain();
            break;
        case QWidgetPrivate::FocusDirection::Next:
            current = current->nextInFocusChain();
            break;
        }
        if (path.contains(current))
            return QWidgetList();
        path << current;
    } while (current != to);

    return path;
}